

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O3

string * __thiscall
cppwinrt::
get_impl_name<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,cppwinrt *this,
          basic_string_view<char,_std::char_traits<char>_> *first,
          basic_string_view<char,_std::char_traits<char>_> *rest)

{
  long lVar1;
  size_t sVar2;
  anon_class_8_1_6971b95b convert;
  char cVar3;
  long lVar4;
  size_t sVar5;
  _Alloc_hider local_58;
  size_type local_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  
  local_58._M_p = &local_48;
  local_50 = 0;
  local_48 = '\0';
  lVar1 = *(long *)this;
  cVar3 = (char)&local_58;
  local_38 = first;
  if (lVar1 != 0) {
    lVar4 = 0;
    do {
      std::__cxx11::string::push_back(cVar3);
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  std::__cxx11::string::push_back(cVar3);
  sVar2 = local_38->_M_len;
  if (sVar2 != 0) {
    sVar5 = 0;
    do {
      std::__cxx11::string::push_back(cVar3);
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_58._M_p == &local_48) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_47,local_48);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_40;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_58._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_47,local_48);
  }
  __return_storage_ptr__->_M_string_length = local_50;
  return __return_storage_ptr__;
}

Assistant:

auto get_impl_name(First const& first, Rest const&... rest)
    {
        std::string result;

        auto convert = [&](auto&& value)
        {
            for (auto&& c : value)
            {
                result += c == '.' ? '_' : c;
            }
        };

        convert(first);
        ((result += '_', convert(rest)), ...);
        return result;
    }